

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_crg_putparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *out)

{
  int iVar1;
  jpc_crgcomp_t *local_40;
  jpc_crgcomp_t *comp;
  int compno;
  jpc_crg_t *crg;
  jas_stream_t *out_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  comp._4_4_ = 0;
  local_40 = (ms->parms).crg.comps;
  while( true ) {
    if ((ms->parms).soc <= comp._4_4_) {
      return 0;
    }
    iVar1 = jpc_putuint16(out,local_40->hoff);
    if ((iVar1 != 0) || (iVar1 = jpc_putuint16(out,local_40->voff), iVar1 != 0)) break;
    comp._4_4_ = comp._4_4_ + 1;
    local_40 = local_40 + 1;
  }
  return -1;
}

Assistant:

static int jpc_crg_putparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *out)
{
	jpc_crg_t *crg = &ms->parms.crg;
	int compno;
	jpc_crgcomp_t *comp;

	/* Eliminate compiler warning about unused variables. */
	(void)cstate;

	for (compno = 0, comp = crg->comps; compno < crg->numcomps; ++compno,
	  ++comp) {
		if (jpc_putuint16(out, comp->hoff) ||
		  jpc_putuint16(out, comp->voff)) {
			return -1;
		}
	}
	return 0;
}